

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O1

bool pstore::command_line::details::parse_positional_arguments<char*const*>
               (char **first_arg,char **last_arg)

{
  option *this;
  char cVar1;
  int iVar2;
  int iVar3;
  _List_node_base *p_Var4;
  byte bVar5;
  _List_node_base *p_Var6;
  allocator local_59;
  char **local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_58 = last_arg;
  p_Var4 = (_List_node_base *)option::all_abi_cxx11_();
  p_Var6 = p_Var4->_M_next;
  while ((p_Var6 != p_Var4 &&
         (cVar1 = (**(code **)(*(long *)p_Var6[1]._M_next + 0x48))(), cVar1 == '\0'))) {
    p_Var6 = p_Var6->_M_next;
  }
  bVar5 = 1;
  if (p_Var6 != p_Var4 && first_arg != local_58) {
    do {
      this = (option *)p_Var6[1]._M_next;
      iVar2 = (*this->_vptr_option[9])(this);
      if ((char)iVar2 == '\0') {
        assert_failed("handler->is_positional ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/command_line/command_line.hpp"
                      ,300);
      }
      iVar2 = (*this->_vptr_option[0x10])(this);
      std::__cxx11::string::string((string *)local_50,*first_arg,&local_59);
      iVar3 = (*this->_vptr_option[0xf])(this,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      cVar1 = option::can_accept_another_occurrence(this);
      while ((cVar1 == '\0' &&
             (p_Var6 = (((_List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
                          *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
             p_Var6 != p_Var4))) {
        cVar1 = (**(code **)((long)(p_Var6[1]._M_next)->_M_next + 0x48))();
      }
      first_arg = first_arg + 1;
    } while ((first_arg != local_58) && (p_Var6 != p_Var4));
    bVar5 = (byte)iVar2 & (byte)iVar3;
  }
  return (bool)bVar5;
}

Assistant:

bool parse_positional_arguments (InputIterator first_arg, InputIterator last_arg) {
                bool ok = true;

                auto const & all_options = option::all ();
                auto const is_positional = [] (option const * const opt) {
                    return opt->is_positional ();
                };

                auto end = std::end (all_options);
                auto it = std::find_if (std::begin (all_options), end, is_positional);
                for (; first_arg != last_arg && it != end; ++first_arg) {
                    option * const handler = *it;
                    PSTORE_ASSERT (handler->is_positional ());
                    ok = handler->add_occurrence ();
                    if (!handler->value (*first_arg)) {
                        ok = false;
                    }
                    if (!handler->can_accept_another_occurrence ()) {
                        it = std::find_if (++it, end, is_positional);
                    }
                }
                return ok;
            }